

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_status64(int op,sqlite3_int64 *pCurrent,sqlite3_int64 *pHighwater,int resetFlag)

{
  int in_ECX;
  sqlite3StatValueType *in_RDX;
  sqlite3StatValueType *in_RSI;
  int in_EDI;
  sqlite3_mutex *pMutex;
  int local_4;
  
  if ((in_EDI < 0) || (9 < in_EDI)) {
    local_4 = sqlite3MisuseError(0);
  }
  else {
    if (""[in_EDI] == '\0') {
      sqlite3MallocMutex();
    }
    else {
      sqlite3Pcache1Mutex();
    }
    sqlite3_mutex_enter((sqlite3_mutex *)0x131a69);
    *in_RSI = sqlite3Stat.nowValue[in_EDI];
    *in_RDX = sqlite3Stat.mxValue[in_EDI];
    if (in_ECX != 0) {
      sqlite3Stat.mxValue[in_EDI] = sqlite3Stat.nowValue[in_EDI];
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x131acc);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_status64(
  int op,
  sqlite3_int64 *pCurrent,
  sqlite3_int64 *pHighwater,
  int resetFlag
){
  sqlite3_mutex *pMutex;
  wsdStatInit;
  if( op<0 || op>=ArraySize(wsdStat.nowValue) ){
    return SQLITE_MISUSE_BKPT;
  }
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCurrent==0 || pHighwater==0 ) return SQLITE_MISUSE_BKPT;
#endif
  pMutex = statMutex[op] ? sqlite3Pcache1Mutex() : sqlite3MallocMutex();
  sqlite3_mutex_enter(pMutex);
  *pCurrent = wsdStat.nowValue[op];
  *pHighwater = wsdStat.mxValue[op];
  if( resetFlag ){
    wsdStat.mxValue[op] = wsdStat.nowValue[op];
  }
  sqlite3_mutex_leave(pMutex);
  (void)pMutex;  /* Prevent warning when SQLITE_THREADSAFE=0 */
  return SQLITE_OK;
}